

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O2

void __thiscall xray_re::se_stalker::state_write(se_stalker *this,xr_packet *packet)

{
  ushort uVar1;
  long lVar2;
  
  cse_alife_human_stalker::state_write(&this->super_cse_alife_human_stalker,packet);
  uVar1 = *(ushort *)
           &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
            super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x28;
  if (uVar1 < 0x80) {
    if (uVar1 < 0x7a) {
      if (uVar1 == 0x65) {
        lVar2 = 0x321;
        if (1 < *(ushort *)
                 &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
                  super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x2a)
        goto LAB_0018cef7;
      }
      else {
        if (uVar1 != 0x76) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                        ,0x198,"virtual void xray_re::se_stalker::state_write(xr_packet &)");
        }
        if ((2 < *(ushort *)
                  &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
                   super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x2a) &&
           ((*packet->_vptr_xr_packet[10])(packet,(ulong)this->m_job_online),
           4 < *(ushort *)
                &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
                 super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x2a)) {
          (*packet->_vptr_xr_packet[0xc])(packet,(ulong)this->m_was_in_smart_terrain);
          lVar2 = 0x322;
          if (5 < *(ushort *)
                   &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
                    super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x2a)
          goto LAB_0018cef7;
        }
      }
    }
    else {
      if (0x7c < uVar1) {
        __assert_fail("m_version <= CSE_VERSION_CS",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,0x184,"virtual void xray_re::se_stalker::state_write(xr_packet &)");
      }
      (*packet->_vptr_xr_packet[10])(packet,(ulong)this->m_job_online);
      if (2 < this->m_job_online) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,0x187,"virtual void xray_re::se_stalker::state_write(xr_packet &)");
      }
      (*packet->_vptr_xr_packet[0xc])(packet,(ulong)this->m_death_dropped);
      if (6 < *(ushort *)
               &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
                super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x2a) {
        (*packet->_vptr_xr_packet[4])(packet,&this->m_squad_id);
        lVar2 = 0x348;
        if (7 < *(ushort *)
                 &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
                  super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x2a)
        goto LAB_0018cef7;
      }
    }
    return;
  }
  if (uVar1 != 0x80) {
    __assert_fail("m_version <= CSE_VERSION_COP",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                  ,0x17e,"virtual void xray_re::se_stalker::state_write(xr_packet &)");
  }
  (*packet->_vptr_xr_packet[4])(packet,&this->m_old_lvid);
  (*packet->_vptr_xr_packet[4])(packet,&this->m_active_section);
  lVar2 = 0x322;
LAB_0018cef7:
  (*packet->_vptr_xr_packet[0xc])
            (packet,(ulong)*(byte *)((long)&(this->super_cse_alife_human_stalker).
                                            super_cse_alife_human_abstract.
                                            super_cse_alife_trader_abstract.
                                            _vptr_cse_alife_trader_abstract + lVar2));
  return;
}

Assistant:

void se_stalker::state_write(xr_packet& packet)
{
	cse_alife_human_stalker::state_write(packet);
	if (m_version >= CSE_VERSION_0x80) {
		xr_assert(m_version <= CSE_VERSION_COP);
		
		packet.w_sz(m_old_lvid);
		packet.w_sz(m_active_section);
		packet.w_bool(m_death_dropped);
	} else if (m_version >= CSE_VERSION_0x7a) {
		xr_assert(m_version <= CSE_VERSION_CS);
		packet.w_u8(m_job_online);
		if (m_job_online > 2)
			xr_not_expected();
		packet.w_bool(m_death_dropped);
		if (m_script_version >= 7)
			packet.w_sz(m_squad_id);
		if (m_script_version >= 8)
			packet.w_bool(m_sim_forced_online);
	} else if (m_version == CSE_VERSION_SOC) {
		if (m_script_version >= 3)
			packet.w_u8(m_job_online);
		if (m_script_version >= 5)
			packet.w_bool(m_was_in_smart_terrain);
		if (m_script_version >= 6)
			packet.w_bool(m_death_dropped);
	} else if (m_version == CSE_VERSION_2215) {
		if (m_script_version >= 2)
			packet.w_bool(m_was_in_smart_terrain);
	} else {
		xr_not_implemented();
	}
}